

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

int __thiscall libtorrent::aux::torrent::init(torrent *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  _Atomic_word *p_Var2;
  vector<download_priority_t,_file_index_t> *this_00;
  uchar uVar3;
  download_priority_t new_piece_priority;
  int iVar4;
  uint uVar5;
  element_type *this_01;
  add_torrent_params *paVar6;
  element_type *this_02;
  pointer pppVar7;
  session_interface *psVar8;
  pointer pcVar9;
  libtorrent *this_03;
  undefined8 uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  char cVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  file_index_t fVar16;
  file_index_t fVar17;
  int extraout_EAX;
  _Rb_tree_node_base *p_Var18;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar19;
  int64_t iVar20;
  ulong uVar21;
  undefined4 extraout_var;
  pointer pppVar22;
  pointer psVar23;
  pointer plVar24;
  piece_index_t pVar25;
  torrent *ptVar26;
  piece_index_t piece;
  EVP_PKEY_CTX *__r;
  size_type __new_size;
  char *in_R9;
  pointer psVar27;
  long lVar28;
  torrent *ptVar29;
  element_type *peVar30;
  pointer pbVar31;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  long lVar32;
  string_view sVar33;
  peer_request pVar34;
  string_view rhs;
  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  ts;
  vector<std::string,_file_index_t> links;
  shared_ptr<libtorrent::aux::peer_connection> pc;
  undefined1 local_1d8 [40];
  pointer local_1b0;
  undefined1 local_1a8 [32];
  undefined1 local_188 [28];
  undefined8 uStack_16c;
  undefined8 local_164;
  undefined8 uStack_15c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  shared_ptr<const_libtorrent::torrent_info> local_128;
  shared_ptr<const_libtorrent::torrent_info> local_118;
  resolve_links local_108;
  pointer local_70;
  per_timer_data *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"init torrent: %s",
             (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_name._M_dataplus._M_p);
  this_00 = &this->m_file_priority;
  iVar15 = *(int *)&(this->m_file_priority).
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    .
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = *(int *)&(this->m_file_priority).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  iVar14 = file_storage::num_files
                     (&((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_files);
  if (iVar14 < iVar15 - iVar4) {
    iVar15 = file_storage::num_files
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&this_00->
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ,(long)iVar15);
  }
  else if (((((this->m_add_torrent_params)._M_t.
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl)->flags).
            m_val & 0x800000) != 0) {
    iVar15 = file_storage::num_files
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&this_00->
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ,(long)iVar15,(value_type *)&dont_download);
  }
  sVar33 = torrent_info::ssl_cert
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  if (sVar33._M_len != 0) {
    this->field_0x5e0 = this->field_0x5e0 | 2;
    init_ssl(this,sVar33);
  }
  this_01 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar15 = (this_01->m_files).m_num_pieces;
  if (iVar15 == 0) {
    local_108.m_torrent_file.
    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
         errors::make_error_code(torrent_invalid_length);
  }
  else if (iVar15 == 0x7fffffff) {
    local_108.m_torrent_file.
    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
         errors::make_error_code(too_many_pieces_in_torrent);
  }
  else {
    if ((this_01->m_files).m_piece_length < 0x1fffc001) {
      paVar6 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if (paVar6 != (add_torrent_params *)0x0) {
        for (p_Var18 = (paVar6->renamed_files).
                       super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var18 !=
            &(paVar6->renamed_files).
             super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
            p_Var18 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var18)) {
          if (-1 < (int)p_Var18[1]._M_color) {
            fVar16 = file_storage::end_file(&this_01->m_files);
            if ((int)p_Var18[1]._M_color < fVar16.m_val) {
              torrent_info::rename_file
                        ((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(file_index_t)p_Var18[1]._M_color,(string *)&p_Var18[1]._M_parent);
            }
          }
        }
      }
      construct_storage(this);
      uVar21 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      if ((((uint)uVar21 >> 0x1d & 1) != 0) &&
         (this_02 = (this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         0 < (this_02->m_files).m_piece_length)) {
        psVar23 = (this->m_file_priority).
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  .
                  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->m_file_priority).
            super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            .
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar23) {
          (this->m_file_priority).
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar23;
        }
        iVar15 = file_storage::num_files(&this_02->m_files);
        ::std::
        vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ::resize(&this_00->
                  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ,(long)iVar15,(value_type *)&dont_download);
        uVar21 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      }
      if (((uint)uVar21 >> 0x19 & 1) == 0) {
        *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar21 | 0x2000000;
        pppVar22 = (this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pppVar7 = (this->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pppVar22 != pppVar7) {
          do {
            __r = (EVP_PKEY_CTX *)
                  &(*pppVar22)->super_enable_shared_from_this<libtorrent::aux::peer_connection>;
            ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<libtorrent::aux::peer_connection,void>
                      ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                       &local_108,
                       (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                       __r);
            cVar12 = (**(code **)(*(long *)&(local_108.m_torrent_file.
                                             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_files + 8))();
            if (cVar12 == '\0') {
              peer_connection::on_metadata_impl
                        ((peer_connection *)
                         local_108.m_torrent_file.
                         super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              cVar12 = (**(code **)(*(long *)&(local_108.m_torrent_file.
                                               super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_files + 8))();
              if (cVar12 == '\0') {
                peer_connection::init
                          ((peer_connection *)
                           local_108.m_torrent_file.
                           super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,__r);
              }
            }
            if (local_108.m_torrent_file.
                super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_108.m_torrent_file.
                         super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            pppVar22 = pppVar22 + 1;
          } while (pppVar22 != pppVar7);
        }
      }
      if ((this->m_file_priority).
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_file_priority).
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar3 = (this->m_need_save_resume_data).m_val;
        update_piece_priorities(this,this_00);
        (this->m_need_save_resume_data).m_val = uVar3;
      }
      paVar6 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if (paVar6 != (add_torrent_params *)0x0) {
        psVar23 = *(pointer *)
                   &(paVar6->piece_priorities).
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl;
        psVar27 = (paVar6->piece_priorities).
                  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __new_size = (size_type)
                     (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces;
        if (__new_size < (ulong)((long)psVar27 - (long)psVar23)) {
          ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::resize(&paVar6->piece_priorities,__new_size);
          paVar6 = (this->m_add_torrent_params)._M_t.
                   super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                   .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
          psVar23 = *(pointer *)
                     &(paVar6->piece_priorities).
                      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                      ._M_impl;
          psVar27 = (paVar6->piece_priorities).
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (psVar23 != psVar27) {
          lVar32 = 0;
          do {
            new_piece_priority.m_val = psVar23[lVar32].m_val;
            if (((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
                 (piece_picker *)0x0) || (new_piece_priority.m_val != '\x04')) {
              need_picker(this);
              piece_picker::set_piece_priority
                        ((this->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                         ,(piece_index_t)(int)lVar32,new_piece_priority);
            }
            lVar28 = lVar32 + 1;
            lVar32 = lVar32 + 1;
          } while (psVar23 + lVar28 != psVar27);
        }
        update_gauge(this);
      }
      if ((this->field_0x5cc & 4) == 0) {
        need_picker(this);
        this->m_padding_bytes = 0;
        local_108.m_links.
        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        .
        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
        iVar19 = file_storage::file_range(&this_01->m_files);
        local_1b0 = (pointer)((ulong)iVar19 >> 0x20);
        if (iVar19._begin.m_val.m_val != iVar19._end.m_val.m_val) {
          do {
            fVar16.m_val = (int)iVar19._begin.m_val;
            bVar13 = file_storage::pad_file_at(&this_01->m_files,fVar16);
            if ((bVar13) &&
               (iVar20 = file_storage::file_size(&this_01->m_files,fVar16), iVar20 != 0)) {
              iVar20 = file_storage::file_size(&this_01->m_files,fVar16);
              pVar34 = file_storage::map_file(&this_01->m_files,fVar16,iVar20 + -1,0);
              uVar21 = pVar34._0_8_;
              if ((((pVar34.start + 1) % (this_01->m_files).m_piece_length == 0) ||
                  (fVar17 = file_storage::end_file(&this_01->m_files),
                  fVar17.m_val + -1 <= fVar16.m_val)) &&
                 (iVar20 = file_storage::file_size(&this_01->m_files,fVar16), 0 < iVar20)) {
                do {
                  pVar25.m_val = (int)uVar21;
                  iVar15 = file_storage::piece_size(&this_01->m_files,pVar25);
                  lVar32 = (long)iVar15;
                  if (iVar20 < iVar15) {
                    lVar32 = iVar20;
                  }
                  local_188._0_4_ = pVar25.m_val;
                  this->m_padding_bytes = this->m_padding_bytes + lVar32;
                  iVar15 = file_storage::piece_size(&this_01->m_files,pVar25);
                  piece.m_val = pVar25.m_val;
                  if (iVar15 == (int)lVar32) {
                    if ((pointer)local_108.m_torrent_file.
                                 super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi ==
                        local_108.m_links.
                        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                        .
                        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      ::std::
                      vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                      ::
                      _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                                ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                                  *)&local_108,
                                 (iterator)
                                 local_108.m_torrent_file.
                                 super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi,
                                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                 local_188);
                      piece.m_val = local_188._0_4_;
                    }
                    else {
                      *(int *)&(local_108.m_torrent_file.
                                super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_vptr__Sp_counted_base = pVar25.m_val;
                      local_108.m_torrent_file.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi =
                           local_108.m_torrent_file.
                           super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 4;
                    }
                  }
                  piece_picker::set_pad_bytes
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,piece,(int)lVar32);
                  uVar21 = (ulong)(pVar25.m_val - 1);
                  lVar28 = iVar20 - lVar32;
                  bVar13 = lVar32 <= iVar20;
                  iVar20 = lVar28;
                } while (lVar28 != 0 && bVar13);
              }
            }
            iVar19._begin.m_val = fVar16.m_val + 1;
            iVar19._end.m_val = 0;
          } while (iVar19._begin.m_val != (uint)local_1b0);
        }
        _Var11._M_pi = local_108.m_torrent_file.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        peVar30 = local_108.m_torrent_file.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (local_108.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)
            local_108.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi) {
          do {
            pVar25.m_val = (peVar30->m_files).m_piece_length;
            bVar13 = piece_picker::have_piece
                               ((this->super_torrent_hot_members).m_picker._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                _M_head_impl,pVar25);
            if (!bVar13) {
              we_have(this,pVar25,false);
            }
            peVar30 = (element_type *)&(peVar30->m_files).m_num_pieces;
          } while (peVar30 != (element_type *)_Var11._M_pi);
        }
        if (local_108.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          operator_delete(local_108.m_torrent_file.
                          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(long)local_108.m_links.
                                        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                        .
                                        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                  (long)local_108.m_torrent_file.
                                        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr);
        }
      }
      else {
        puVar1 = &(this->super_torrent_hot_members).field_0x4b;
        *puVar1 = *puVar1 | 0x40;
        update_gauge(this);
        update_state_list(this);
        bVar13 = want_tick(this);
        update_list(this,(torrent_list_index_t)0x1,bVar13);
      }
      set_state(this,checking_resume_data);
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      torrent_info::similar_torrents
                ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )&local_108,
                 (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar13 = true;
      if (local_108.m_torrent_file.
          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)
          local_108.m_torrent_file.
          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi) {
        torrent_info::collections_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_188,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar13 = local_188._0_8_ != local_188._8_8_;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_188);
      }
      if (local_108.m_torrent_file.
          super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        operator_delete(local_108.m_torrent_file.
                        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(long)local_108.m_links.
                                      super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                      .
                                      super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start -
                                (long)local_108.m_torrent_file.
                                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
      }
      if (bVar13) {
        local_118.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_118.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_118.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_118.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_118.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_118.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        resolve_links::resolve_links(&local_108,&local_118);
        if (local_118.super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.
                     super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        torrent_info::similar_torrents
                  ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    *)local_1a8,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        uVar10 = local_1a8._8_8_;
        for (pbVar31 = (pointer)local_1a8._0_8_; pbVar31 != (pointer)uVar10;
            pbVar31 = (pointer)((pbVar31->field_2)._M_local_buf + 4)) {
          psVar8 = (this->super_torrent_hot_members).m_ses;
          local_188._0_8_ =
               *(undefined8 *)((array<unsigned_int,_5UL> *)&pbVar31->_M_dataplus)->_M_elems;
          local_188._8_8_ = pbVar31->_M_string_length;
          local_188._16_4_ = *(undefined4 *)&pbVar31->field_2;
          local_164 = 0;
          uStack_15c = 0;
          local_188._20_4_ = 0;
          local_188._24_4_ = 0;
          uStack_16c = 0;
          (*(psVar8->super_session_logger)._vptr_session_logger[0x16])(local_1d8,psVar8,local_188);
          if ((torrent *)local_1d8._8_8_ != (torrent *)0x0) {
            iVar15 = *(int *)&(((torrent_hot_members *)(local_1d8._8_8_ + 8))->m_picker)._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl;
            do {
              if (iVar15 == 0) {
                ptVar29 = (torrent *)0x0;
                goto LAB_0030ca30;
              }
              LOCK();
              iVar4 = *(int *)&(((torrent_hot_members *)(local_1d8._8_8_ + 8))->m_picker)._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl;
              bVar13 = iVar15 == iVar4;
              if (bVar13) {
                *(int *)&(((torrent_hot_members *)(local_1d8._8_8_ + 8))->m_picker)._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                     = iVar15 + 1;
                iVar4 = iVar15;
              }
              iVar15 = iVar4;
              UNLOCK();
            } while (!bVar13);
            ptVar26 = (torrent *)local_1d8._0_8_;
            ptVar29 = (torrent *)local_1d8._8_8_;
            if (*(int *)&(((torrent_hot_members *)(local_1d8._8_8_ + 8))->m_picker)._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                == 0) {
LAB_0030ca30:
              ptVar26 = (torrent *)0x0;
            }
            if ((torrent *)local_1d8._8_8_ != (torrent *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = (_Atomic_word *)(local_1d8._8_8_ + 0xc);
                iVar15 = *p_Var2;
                *p_Var2 = *p_Var2 + -1;
                UNLOCK();
              }
              else {
                iVar15 = *(_Atomic_word *)(local_1d8._8_8_ + 0xc);
                *(int *)(local_1d8._8_8_ + 0xc) = iVar15 + -1;
              }
              if (iVar15 == 1) {
                (**(code **)(*(long *)&((file_storage *)local_1d8._8_8_)->m_piece_length + 0x18))();
              }
            }
            if ((ptVar26 != (torrent *)0x0) && (bVar13 = is_seed(ptVar26), bVar13)) {
              local_1d8._0_8_ =
                   (ptVar26->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (((file_storage *)&((torrent *)local_1d8._0_8_)->super_request_callback)->
                  m_piece_length < 1) {
                local_1d8._0_8_ = (torrent *)0x0;
                local_1d8._8_8_ = (torrent *)0x0;
              }
              else {
                local_1d8._8_8_ =
                     (ptVar26->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if ((torrent *)local_1d8._8_8_ != (torrent *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&(((torrent *)local_1d8._8_8_)->super_torrent_hot_members).m_picker._M_t
                             .
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> =
                         *(int *)&(((torrent *)local_1d8._8_8_)->super_torrent_hot_members).m_picker
                                  ._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> + 1
                    ;
                    UNLOCK();
                  }
                  else {
                    *(int *)&(((torrent *)local_1d8._8_8_)->super_torrent_hot_members).m_picker._M_t
                             .
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> =
                         *(int *)&(((torrent *)local_1d8._8_8_)->super_torrent_hot_members).m_picker
                                  ._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> + 1
                    ;
                  }
                }
              }
              local_188._0_8_ = local_188 + 0x10;
              pcVar9 = (ptVar26->m_save_path)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_188,pcVar9,pcVar9 + (ptVar26->m_save_path)._M_string_length
                        );
              resolve_links::match
                        (&local_108,(shared_ptr<const_libtorrent::torrent_info> *)local_1d8,
                         (string *)local_188);
              if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
                operator_delete((void *)local_188._0_8_,
                                CONCAT44(local_188._20_4_,local_188._16_4_) + 1);
              }
              if ((torrent *)local_1d8._8_8_ != (torrent *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
              }
            }
            if (ptVar29 != (torrent *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar29);
            }
          }
        }
        if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
        }
        torrent_info::collections_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a8,
                   (this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_1b0 = (pointer)local_1a8._8_8_;
        if (local_1a8._0_8_ != local_1a8._8_8_) {
          pbVar31 = (pointer)local_1a8._0_8_;
          do {
            psVar8 = (this->super_torrent_hot_members).m_ses;
            (*(psVar8->super_session_logger)._vptr_session_logger[0x27])(local_1d8,psVar8,pbVar31);
            uVar10 = local_1d8._8_8_;
            for (ptVar29 = (torrent *)local_1d8._0_8_; ptVar29 != (torrent *)uVar10;
                ptVar29 = (torrent *)&(ptVar29->super_torrent_hot_members).m_hash_picker) {
              ptVar26 = *(torrent **)
                         &((file_storage *)&ptVar29->super_request_callback)->m_piece_length;
              bVar13 = is_seed(ptVar26);
              if (bVar13) {
                local_128.
                super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (ptVar26->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                if (((local_128.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_files).m_piece_length < 1) {
                  local_128.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_128.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                else {
                  local_128.
                  super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (ptVar26->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                  if (local_128.
                      super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_128.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_128.
                            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_128.
                       super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_128.
                            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                }
                lVar32 = *(long *)&((file_storage *)&ptVar29->super_request_callback)->
                                   m_piece_length;
                lVar28 = *(long *)(lVar32 + 0x3c0);
                local_188._0_8_ = (pointer)(local_188 + 0x10);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_188,lVar28,*(long *)(lVar32 + 0x3c8) + lVar28);
                resolve_links::match(&local_108,&local_128,(string *)local_188);
                if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
                  operator_delete((void *)local_188._0_8_,
                                  CONCAT44(local_188._20_4_,local_188._16_4_) + 1);
                }
                if (local_128.
                    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_128.
                             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
            }
            ::std::
            vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
            ::~vector((vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                       *)local_1d8);
            pbVar31 = pbVar31 + 1;
          } while (pbVar31 != local_1b0);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a8);
        if (local_108.m_links.
            super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            .
            super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_108.m_links.
            super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            .
            super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar15 = file_storage::num_files
                             (&((this->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_files);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&local_148,(long)iVar15);
          local_70 = local_108.m_links.
                     super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                     .
                     super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (local_108.m_links.
              super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              .
              super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_108.m_links.
              super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              .
              super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            plVar24 = local_108.m_links.
                      super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                      .
                      super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              peVar30 = (plVar24->ti).
                        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (peVar30 != (element_type *)0x0) {
                local_1b0 = (pointer)(plVar24->save_path)._M_dataplus._M_p;
                this_03 = (libtorrent *)(plVar24->save_path)._M_string_length;
                fVar16.m_val = (plVar24->file_idx).m_val;
                local_1d8._0_8_ = local_1d8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"");
                file_storage::file_path
                          ((string *)local_1a8,&peVar30->m_files,fVar16,(string *)local_1d8);
                sVar33._M_str = (char *)local_1a8._8_8_;
                sVar33._M_len = (size_t)local_1b0;
                rhs._M_str = in_R9;
                rhs._M_len = local_1a8._0_8_;
                combine_path_abi_cxx11_((string *)local_188,this_03,sVar33,rhs);
                ::std::__cxx11::string::operator=
                          ((string *)
                           (local_148.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (plVar24->file_idx).m_val),
                           (string *)local_188);
                if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
                  operator_delete((void *)local_188._0_8_,
                                  CONCAT44(local_188._20_4_,local_188._16_4_) + 1);
                }
                if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
                }
                if ((torrent *)local_1d8._0_8_ != (torrent *)(local_1d8 + 0x10)) {
                  operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
                }
              }
              plVar24 = plVar24 + 1;
            } while (plVar24 != local_70);
          }
        }
        ::std::
        _Hashtable<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<256L>_>,_std::hash<libtorrent::digest32<256L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
        ::~_Hashtable(&local_108.m_file_roots._M_h);
        ::std::
        _Hashtable<long,_std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
        ::~_Hashtable(&local_108.m_file_sizes._M_h);
        ::std::
        vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        ::~vector(&local_108.m_links.
                   super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                 );
        if (local_108.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.m_torrent_file.
                     super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      paVar6 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      if ((paVar6 == (add_torrent_params *)0x0) || (((paVar6->flags).m_val & 0x400000) == 0)) {
        iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[4])();
        uVar5 = (this->m_storage).m_idx.m_val;
        paVar6 = (this->m_add_torrent_params)._M_t.
                 super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
                 .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_108,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        local_58 = (code *)0x0;
        pcStack_50 = (code *)0x0;
        local_68 = (per_timer_data *)0x0;
        uStack_60 = 0;
        local_68 = (per_timer_data *)operator_new(0x10);
        *(undefined4 *)&(local_68->op_queue_).front_ =
             local_108.m_torrent_file.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_4_;
        *(undefined4 *)((long)&(local_68->op_queue_).front_ + 4) =
             local_108.m_torrent_file.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _4_4_;
        *(undefined4 *)&(local_68->op_queue_).back_ =
             local_108.m_torrent_file.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._0_4_;
        *(undefined4 *)((long)&(local_68->op_queue_).back_ + 4) =
             local_108.m_torrent_file.
             super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
        local_108.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
        pcStack_50 = ::std::
                     _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:1993:25)>
                     ::_M_invoke;
        local_58 = ::std::
                   _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:1993:25)>
                   ::_M_manager;
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar15) + 0x40))
                  ((long *)CONCAT44(extraout_var,iVar15),uVar5,paVar6,&local_48);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
        if (local_108.m_torrent_file.
            super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.m_torrent_file.
                     super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        (*(this->super_request_callback)._vptr_request_callback[7])(this,"init, async_check_files");
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
      }
      else {
        local_108.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_108.m_torrent_file.
              super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._5_8_
             << 0x28);
        local_108.m_torrent_file.
        super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                &boost::system::detail::cat_holder<void>::system_category_instance;
        local_108.m_links.
        super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        .
        super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_108.m_links.
                               super_vector<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                               .
                               super__Vector_base<libtorrent::aux::resolve_links::link_t,_std::allocator<libtorrent::aux::resolve_links::link_t>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffff);
        on_resume_data_checked(this,(status_t)0x0,(storage_error *)&local_108);
      }
      update_want_peers(this);
      bVar13 = want_tick(this);
      update_list(this,(torrent_list_index_t)0x1,bVar13);
      maybe_done_flushing(this);
      this->field_0x606 = this->field_0x606 | 0x10;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_148);
      return extraout_EAX;
    }
    local_108.m_torrent_file.
    super___shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
         errors::make_error_code(invalid_piece_size);
  }
  set_error(this,(error_code *)&local_108,(file_index_t)0xffffffff);
  iVar15 = pause(this);
  return iVar15;
}

Assistant:

void torrent::init()
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(is_single_thread());

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("init torrent: %s", torrent_file().name().c_str());
#endif

		TORRENT_ASSERT(valid_metadata());
		TORRENT_ASSERT(m_torrent_file->num_files() > 0);
		TORRENT_ASSERT(m_torrent_file->total_size() >= 0);

		if (int(m_file_priority.size()) > m_torrent_file->num_files())
			m_file_priority.resize(m_torrent_file->num_files());
		else if (m_add_torrent_params->flags & torrent_flags::default_dont_download)
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);

		auto cert = m_torrent_file->ssl_cert();
		if (!cert.empty())
		{
			m_ssl_torrent = true;
#ifdef TORRENT_SSL_PEERS
			init_ssl(cert);
#endif
		}

		if (m_torrent_file->num_pieces() > piece_picker::max_pieces)
		{
			set_error(errors::too_many_pieces_in_torrent, torrent_status::error_file_none);
			pause();
			return;
		}

		if (m_torrent_file->num_pieces() == 0)
		{
			set_error(errors::torrent_invalid_length, torrent_status::error_file_none);
			pause();
			return;
		}

		int const blocks_per_piece
			= (m_torrent_file->piece_length() + default_block_size - 1) / default_block_size;
		if (blocks_per_piece > piece_picker::max_blocks_per_piece)
		{
			set_error(errors::invalid_piece_size, torrent_status::error_file_none);
			pause();
			return;
		}

		// --- MAPPED FILES ---
		file_storage const& fs = m_torrent_file->files();
		if (m_add_torrent_params)
		{
			for (auto const& f : m_add_torrent_params->renamed_files)
			{
				if (f.first < file_index_t(0) || f.first >= fs.end_file()) continue;
				m_torrent_file->rename_file(file_index_t(f.first), f.second);
			}
		}

		construct_storage();

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode && valid_metadata())
		{
			// in share mode, all pieces have their priorities initialized to 0
			m_file_priority.clear();
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);
		}
#endif

		// it's important to initialize the peers early, because this is what will
		// fix up their have-bitmasks to have the correct size
		// TODO: 2 add a unit test where we don't have metadata, connect to a peer
		// that sends a bitfield that's too large, then we get the metadata
		if (!m_connections_initialized)
		{
			m_connections_initialized = true;
			// all peer connections have to initialize themselves now that the metadata
			// is available
			// copy the peer list since peers may disconnect and invalidate
			// m_connections as we initialize them
			for (auto* const c : m_connections)
			{
				auto pc = c->self();
				if (pc->is_disconnecting()) continue;
				pc->on_metadata_impl();
				if (pc->is_disconnecting()) continue;
				pc->init();
			}
		}

		// in case file priorities were passed in via the add_torrent_params
		// and also in the case of share mode, we need to update the priorities
		// this has to be applied before piece priority
		if (!m_file_priority.empty())
		{
			// m_file_priority was loaded from the resume data, this doesn't
			// alter any state that needs to be saved in the resume data
			auto const ns = m_need_save_resume_data;
			update_piece_priorities(m_file_priority);
			m_need_save_resume_data = ns;
		}

		if (m_add_torrent_params)
		{
			piece_index_t idx(0);
			if (m_add_torrent_params->piece_priorities.size() > std::size_t(m_torrent_file->num_pieces()))
				m_add_torrent_params->piece_priorities.resize(std::size_t(m_torrent_file->num_pieces()));

			for (auto prio : m_add_torrent_params->piece_priorities)
			{
				if (has_picker() || prio != default_priority)
				{
					need_picker();
					m_picker->set_piece_priority(idx, prio);
				}
				++idx;
			}
			update_gauge();
		}

		if (m_seed_mode)
		{
			m_have_all = true;
			update_gauge();
			update_state_list();
			update_want_tick();
		}
		else
		{
			need_picker();

			TORRENT_ASSERT(block_size() > 0);

			m_padding_bytes = 0;
			std::vector<piece_index_t> have_pieces;

			aux::apply_pad_files(fs, [&](piece_index_t const piece, int const bytes)
			{
				m_padding_bytes += bytes;
				if (bytes == fs.piece_size(piece))
					have_pieces.push_back(piece);
				m_picker->set_pad_bytes(piece, bytes);
			});

			for (auto i : have_pieces)
			{
				// we may have this piece already, if we picked it up from
				// resume data.
				if (m_picker->have_piece(i)) continue;
//				picker().piece_passed(i);
//				TORRENT_ASSERT(picker().have_piece(i));
				we_have(i);
			}
		}

		set_state(torrent_status::checking_resume_data);

		aux::vector<std::string, file_index_t> links;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		if (!m_torrent_file->similar_torrents().empty()
			|| !m_torrent_file->collections().empty())
		{
			resolve_links res(m_torrent_file);

			for (auto const& ih : m_torrent_file->similar_torrents())
			{
				std::shared_ptr<torrent> t = m_ses.find_torrent(info_hash_t(ih)).lock();
				if (!t) continue;

				// Only attempt to reuse files from torrents that are seeding.
				// TODO: this could be optimized by looking up which files are
				// complete and just look at those
				if (!t->is_seed()) continue;

				res.match(t->get_torrent_file(), t->save_path());
			}
			for (auto const& c : m_torrent_file->collections())
			{
				std::vector<std::shared_ptr<torrent>> ts = m_ses.find_collection(c);

				for (auto const& t : ts)
				{
					// Only attempt to reuse files from torrents that are seeding.
					// TODO: this could be optimized by looking up which files are
					// complete and just look at those
					if (!t->is_seed()) continue;

					res.match(t->get_torrent_file(), t->save_path());
				}
			}

			std::vector<resolve_links::link_t> const& l = res.get_links();
			if (!l.empty())
			{
				links.resize(m_torrent_file->files().num_files());
				for (auto const& i : l)
				{
					if (!i.ti) continue;
					links[i.file_idx] = combine_path(i.save_path
						, i.ti->files().file_path(i.file_idx));
				}
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_outstanding_check_files = true;
#endif

		if (!m_add_torrent_params || !(m_add_torrent_params->flags & torrent_flags::no_verify_files))
		{
			m_ses.disk_thread().async_check_files(
				m_storage, m_add_torrent_params ? m_add_torrent_params.get() : nullptr
				, std::move(links), [self = shared_from_this()](status_t st, storage_error const& error)
				{ self->on_resume_data_checked(st, error); });
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("init, async_check_files");
#endif
			m_ses.deferred_submit_jobs();
		}
		else
		{
			on_resume_data_checked({}, storage_error{});
		}

		update_want_peers();
		update_want_tick();

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();

		m_torrent_initialized = true;
	}